

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

KeyData * __thiscall
cfd::core::Descriptor::GetKeyData
          (KeyData *__return_storage_ptr__,Descriptor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  pointer *this_00;
  bool bVar1;
  undefined1 local_50 [8];
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  copy_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *array_argument_local;
  Descriptor *this_local;
  
  this_00 = &key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00,array_argument);
  GetKeyDataAll((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_50,this,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  bVar1 = ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::empty
                    ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_50);
  if (bVar1) {
    KeyData::KeyData(__return_storage_ptr__);
  }
  else {
    ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_50,0);
    KeyData::KeyData(key_list.
                     super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     key_list.
                     super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)this);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  return __return_storage_ptr__;
}

Assistant:

KeyData Descriptor::GetKeyData(
    const std::vector<std::string>& array_argument) const {
  std::vector<std::string> copy_list = array_argument;
  auto key_list = GetKeyDataAll(&copy_list);
  if (key_list.empty()) return KeyData();
  return key_list[0];
}